

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O0

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,int(*)[256],int*>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               int *buffer_begin,long param_4,long param_5,int *param_6)

{
  difference_type __n;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *pcVar1;
  int *counters;
  anon_class_16_2_d94e93d1 map;
  anon_class_16_2_d94e93d1 map_00;
  anon_class_16_2_5243436b_for_l local_158;
  burst local_148 [8];
  low_byte_fn *local_140;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_130;
  int *local_128;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_120;
  int *local_118;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_110;
  int *local_100;
  int *local_f8;
  int *local_f0;
  anon_class_16_2_5243436b_for_l local_e0;
  burst local_d0 [8];
  low_byte_fn *local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  int *local_b0;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_a8;
  int *local_a0;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  byte local_6a;
  undefined1 local_69;
  bool n1th_is_single;
  int *piStack_68;
  bool nth_is_single;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> buffer_end;
  difference_type range_size;
  size_t radix_number_local;
  int *maximums_local;
  int (*counters_local) [256];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_20;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> map_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> buffer_begin_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  counters = param_6;
  buffer_end._M_current = last._M_current;
  _Stack_20._M_current = buffer_begin;
  __n = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (first,last);
  piStack_68 = _Stack_20._M_current;
  local_60 = std::next<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (_Stack_20,__n);
  local_69 = *(int *)(param_5 + (long)param_6 * 4) == __n;
  local_6a = *(int *)(param_5 + 4 + (long)param_6 * 4) == __n;
  if ((!(bool)local_69) || (!(bool)local_6a)) {
    if ((bool)local_69) {
      local_88 = _Stack_20._M_current;
      local_80 = last._M_current;
      local_78 = first._M_current;
      local_90 = (int *)std::
                        move<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                  (first,last,_Stack_20);
    }
    else {
      local_a0 = first._M_current;
      local_98 = std::
                 make_move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                           (first);
      local_b0 = last._M_current;
      local_a8 = std::
                 make_move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                           (last);
      local_b8._M_current = _Stack_20._M_current;
      local_e0.radix_number = (size_t)nth_radix<burst::low_byte_fn>(param_6);
      compose<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>&>
                (local_d0,&local_e0,
                 (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
                 ((long)&counters_local + 6));
      pcVar1 = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
               std::begin<int,256ul>((int (*) [256])(param_4 + (long)param_6 * 0x400));
      map.radix = local_c8;
      map.map = pcVar1;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,int*>
                (local_98,local_a8,local_b8,map,counters);
    }
    if ((local_6a & 1) == 0) {
      local_118 = _Stack_20._M_current;
      local_110 = std::
                  make_move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (_Stack_20);
      local_128 = local_60._M_current;
      local_120 = std::
                  make_move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (local_60);
      local_130._M_current = first._M_current;
      local_158.radix_number = (size_t)nth_radix<burst::low_byte_fn>((long)param_6 + 1);
      compose<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>&>
                (local_148,&local_158,
                 (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
                 ((long)&counters_local + 6));
      pcVar1 = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
               std::begin<int,256ul>((int (*) [256])(param_4 + ((long)param_6 + 1) * 0x400));
      map_00.radix = local_140;
      map_00.map = pcVar1;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,int*>
                (local_110,local_120,local_130,map_00,counters);
    }
    else {
      local_f0 = _Stack_20._M_current;
      local_f8 = local_60._M_current;
      local_100 = first._M_current;
      std::
      move<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (_Stack_20,local_60,first);
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }